

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcExpand.c
# Opt level: O2

int Abc_ObjExpandCubesTry(Vec_Str_t *vSop,sat_solver *pSat,Vec_Int_t *vVars)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  
  pcVar6 = vSop->pArray;
  iVar2 = Abc_SopGetCubeNum(pcVar6);
  uVar3 = Abc_SopGetVarNum(pcVar6);
  p = Vec_IntAlloc(uVar3);
  p_00 = Vec_IntAlloc(uVar3);
  if (uVar3 == vVars->nSize) {
    if (vSop->nSize == (uVar3 + 3) * iVar2 + 1) {
      uVar1 = uVar3;
      if ((int)uVar3 < 1) {
        uVar1 = 0;
      }
      do {
        if (*pcVar6 == '\0') {
          Vec_IntFree(p);
          Vec_IntFree(p_00);
          return iVar2;
        }
        Vec_IntGrow(p,uVar3);
        for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
          p->pArray[uVar5] = -1;
        }
        p->nSize = uVar3;
        for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
          if (pcVar6[uVar5] != '-') {
            iVar4 = Vec_IntEntry(vVars,(int)uVar5);
            iVar4 = Abc_Var2Lit(iVar4,(uint)(pcVar6[uVar5] == '0'));
            if ((long)p->nSize <= (long)uVar5) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            p->pArray[uVar5] = iVar4;
            pcVar6[uVar5] = '-';
          }
        }
        Bmc_CollapseExpandRound(pSat,(sat_solver *)0x0,p,(Vec_Int_t *)0x0,p_00,0,0,-1);
        for (lVar7 = 0; lVar7 < p->nSize; lVar7 = lVar7 + 1) {
          iVar4 = Vec_IntEntry(p,(int)lVar7);
          if (iVar4 != -1) {
            if (iVar4 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf3,"int Abc_LitIsCompl(int)");
            }
            pcVar6[lVar7] = (byte)iVar4 & 1 ^ 0x31;
          }
        }
        pcVar6 = pcVar6 + (int)(uVar3 + 3);
      } while( true );
    }
    pcVar6 = "Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1";
    uVar3 = 0x41;
  }
  else {
    pcVar6 = "nVars == Vec_IntSize(vVars)";
    uVar3 = 0x40;
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcExpand.c"
                ,uVar3,"int Abc_ObjExpandCubesTry(Vec_Str_t *, sat_solver *, Vec_Int_t *)");
}

Assistant:

int Abc_ObjExpandCubesTry( Vec_Str_t * vSop, sat_solver * pSat, Vec_Int_t * vVars )
{
    extern int Bmc_CollapseExpandRound( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit );

    char * pCube, * pSop = Vec_StrArray(vSop);
    int nCubes = Abc_SopGetCubeNum(pSop);
    int nVars = Abc_SopGetVarNum(pSop);

    Vec_Int_t * vLits = Vec_IntAlloc( nVars );
    Vec_Int_t * vTemp = Vec_IntAlloc( nVars );

    assert( nVars == Vec_IntSize(vVars) );
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
    {
        int k, Entry;
        // collect literals and clean cube
        Vec_IntFill( vLits, nVars, -1 );
        for ( k = 0; k < nVars; k++ )
        {
            if ( pCube[k] == '-' )
                continue;
            Vec_IntWriteEntry( vLits, k, Abc_Var2Lit(Vec_IntEntry(vVars, k), pCube[k] == '0') );
            pCube[k] = '-';
        }
        // expand cube
        Bmc_CollapseExpandRound( pSat, NULL, vLits, NULL, vTemp, 0, 0, -1 );
        // insert literals
        Vec_IntForEachEntry( vLits, Entry, k )
            if ( Entry != -1 )
                pCube[k] = '1' - Abc_LitIsCompl(Entry);
    }

    Vec_IntFree( vLits );
    Vec_IntFree( vTemp );
    return nCubes;
}